

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1.c
# Opt level: O0

void mbedtls_sha1_process(mbedtls_sha1_context *ctx,uchar *data)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  uint32_t E;
  uint32_t D;
  uint32_t C;
  uint32_t B;
  uint32_t A;
  uint32_t W [16];
  uint32_t temp;
  uchar *data_local;
  mbedtls_sha1_context *ctx_local;
  
  uVar1 = (uint)*data << 0x18 | (uint)data[1] << 0x10 | (uint)data[2] << 8 | (uint)data[3];
  uVar2 = (uint)data[4] << 0x18 | (uint)data[5] << 0x10 | (uint)data[6] << 8 | (uint)data[7];
  uVar3 = (uint)data[8] << 0x18 | (uint)data[9] << 0x10 | (uint)data[10] << 8 | (uint)data[0xb];
  uVar4 = (uint)data[0xc] << 0x18 | (uint)data[0xd] << 0x10 | (uint)data[0xe] << 8 | (uint)data[0xf]
  ;
  uVar5 = (uint)data[0x10] << 0x18 | (uint)data[0x11] << 0x10 | (uint)data[0x12] << 8 |
          (uint)data[0x13];
  uVar6 = (uint)data[0x14] << 0x18 | (uint)data[0x15] << 0x10 | (uint)data[0x16] << 8 |
          (uint)data[0x17];
  uVar7 = (uint)data[0x18] << 0x18 | (uint)data[0x19] << 0x10 | (uint)data[0x1a] << 8 |
          (uint)data[0x1b];
  uVar8 = (uint)data[0x1c] << 0x18 | (uint)data[0x1d] << 0x10 | (uint)data[0x1e] << 8 |
          (uint)data[0x1f];
  uVar9 = (uint)data[0x20] << 0x18 | (uint)data[0x21] << 0x10 | (uint)data[0x22] << 8 |
          (uint)data[0x23];
  uVar10 = (uint)data[0x24] << 0x18 | (uint)data[0x25] << 0x10 | (uint)data[0x26] << 8 |
           (uint)data[0x27];
  uVar11 = (uint)data[0x28] << 0x18 | (uint)data[0x29] << 0x10 | (uint)data[0x2a] << 8 |
           (uint)data[0x2b];
  uVar12 = (uint)data[0x2c] << 0x18 | (uint)data[0x2d] << 0x10 | (uint)data[0x2e] << 8 |
           (uint)data[0x2f];
  uVar13 = (uint)data[0x30] << 0x18 | (uint)data[0x31] << 0x10 | (uint)data[0x32] << 8 |
           (uint)data[0x33];
  uVar14 = (uint)data[0x34] << 0x18 | (uint)data[0x35] << 0x10 | (uint)data[0x36] << 8 |
           (uint)data[0x37];
  uVar15 = (uint)data[0x38] << 0x18 | (uint)data[0x39] << 0x10 | (uint)data[0x3a] << 8 |
           (uint)data[0x3b];
  uVar16 = (uint)data[0x3c] << 0x18 | (uint)data[0x3d] << 0x10 | (uint)data[0x3e] << 8 |
           (uint)data[0x3f];
  uVar20 = ctx->state[0];
  uVar18 = ctx->state[1];
  uVar21 = ctx->state[2];
  uVar19 = ctx->state[3];
  uVar17 = (uVar20 << 5 | uVar20 >> 0x1b) + (uVar19 ^ uVar18 & (uVar21 ^ uVar19)) + 0x5a827999 +
           uVar1 + ctx->state[4];
  uVar18 = uVar18 << 0x1e | uVar18 >> 2;
  uVar19 = (uVar17 * 0x20 | uVar17 >> 0x1b) + (uVar21 ^ uVar20 & (uVar18 ^ uVar21)) + 0x5a827999 +
           uVar2 + uVar19;
  uVar20 = uVar20 << 0x1e | uVar20 >> 2;
  uVar21 = (uVar19 * 0x20 | uVar19 >> 0x1b) + (uVar18 ^ uVar17 & (uVar20 ^ uVar18)) + 0x5a827999 +
           uVar3 + uVar21;
  uVar17 = uVar17 * 0x40000000 | uVar17 >> 2;
  uVar18 = (uVar21 * 0x20 | uVar21 >> 0x1b) + (uVar20 ^ uVar19 & (uVar17 ^ uVar20)) + 0x5a827999 +
           uVar4 + uVar18;
  uVar19 = uVar19 * 0x40000000 | uVar19 >> 2;
  uVar20 = (uVar18 * 0x20 | uVar18 >> 0x1b) + (uVar17 ^ uVar21 & (uVar19 ^ uVar17)) + 0x5a827999 +
           uVar5 + uVar20;
  uVar21 = uVar21 * 0x40000000 | uVar21 >> 2;
  uVar17 = (uVar20 * 0x20 | uVar20 >> 0x1b) + (uVar19 ^ uVar18 & (uVar21 ^ uVar19)) + 0x5a827999 +
           uVar6 + uVar17;
  uVar18 = uVar18 * 0x40000000 | uVar18 >> 2;
  uVar19 = (uVar17 * 0x20 | uVar17 >> 0x1b) + (uVar21 ^ uVar20 & (uVar18 ^ uVar21)) + 0x5a827999 +
           uVar7 + uVar19;
  uVar20 = uVar20 * 0x40000000 | uVar20 >> 2;
  uVar21 = (uVar19 * 0x20 | uVar19 >> 0x1b) + (uVar18 ^ uVar17 & (uVar20 ^ uVar18)) + 0x5a827999 +
           uVar8 + uVar21;
  uVar17 = uVar17 * 0x40000000 | uVar17 >> 2;
  uVar18 = (uVar21 * 0x20 | uVar21 >> 0x1b) + (uVar20 ^ uVar19 & (uVar17 ^ uVar20)) + 0x5a827999 +
           uVar9 + uVar18;
  uVar19 = uVar19 * 0x40000000 | uVar19 >> 2;
  uVar20 = (uVar18 * 0x20 | uVar18 >> 0x1b) + (uVar17 ^ uVar21 & (uVar19 ^ uVar17)) + 0x5a827999 +
           uVar10 + uVar20;
  uVar21 = uVar21 * 0x40000000 | uVar21 >> 2;
  uVar17 = (uVar20 * 0x20 | uVar20 >> 0x1b) + (uVar19 ^ uVar18 & (uVar21 ^ uVar19)) + 0x5a827999 +
           uVar11 + uVar17;
  uVar18 = uVar18 * 0x40000000 | uVar18 >> 2;
  uVar19 = (uVar17 * 0x20 | uVar17 >> 0x1b) + (uVar21 ^ uVar20 & (uVar18 ^ uVar21)) + 0x5a827999 +
           uVar12 + uVar19;
  uVar20 = uVar20 * 0x40000000 | uVar20 >> 2;
  uVar21 = (uVar19 * 0x20 | uVar19 >> 0x1b) + (uVar18 ^ uVar17 & (uVar20 ^ uVar18)) + 0x5a827999 +
           uVar13 + uVar21;
  uVar17 = uVar17 * 0x40000000 | uVar17 >> 2;
  uVar18 = (uVar21 * 0x20 | uVar21 >> 0x1b) + (uVar20 ^ uVar19 & (uVar17 ^ uVar20)) + 0x5a827999 +
           uVar14 + uVar18;
  uVar19 = uVar19 * 0x40000000 | uVar19 >> 2;
  uVar20 = (uVar18 * 0x20 | uVar18 >> 0x1b) + (uVar17 ^ uVar21 & (uVar19 ^ uVar17)) + 0x5a827999 +
           uVar15 + uVar20;
  uVar21 = uVar21 * 0x40000000 | uVar21 >> 2;
  uVar17 = (uVar20 * 0x20 | uVar20 >> 0x1b) + (uVar19 ^ uVar18 & (uVar21 ^ uVar19)) + 0x5a827999 +
           uVar16 + uVar17;
  uVar18 = uVar18 * 0x40000000 | uVar18 >> 2;
  uVar1 = uVar14 ^ uVar9 ^ uVar3 ^ uVar1;
  uVar22 = uVar1 << 1 | uVar1 >> 0x1f;
  uVar19 = (uVar17 * 0x20 | uVar17 >> 0x1b) + (uVar21 ^ uVar20 & (uVar18 ^ uVar21)) + 0x5a827999 +
           uVar22 + uVar19;
  uVar20 = uVar20 * 0x40000000 | uVar20 >> 2;
  uVar2 = uVar15 ^ uVar10 ^ uVar4 ^ uVar2;
  uVar2 = uVar2 << 1 | uVar2 >> 0x1f;
  uVar21 = (uVar19 * 0x20 | uVar19 >> 0x1b) + (uVar18 ^ uVar17 & (uVar20 ^ uVar18)) + 0x5a827999 +
           uVar2 + uVar21;
  uVar1 = uVar17 * 0x40000000 | uVar17 >> 2;
  uVar3 = uVar16 ^ uVar11 ^ uVar5 ^ uVar3;
  uVar3 = uVar3 << 1 | uVar3 >> 0x1f;
  uVar18 = (uVar21 * 0x20 | uVar21 >> 0x1b) + (uVar20 ^ uVar19 & (uVar1 ^ uVar20)) + 0x5a827999 +
           uVar3 + uVar18;
  uVar19 = uVar19 * 0x40000000 | uVar19 >> 2;
  uVar4 = uVar22 ^ uVar12 ^ uVar6 ^ uVar4;
  uVar4 = uVar4 << 1 | uVar4 >> 0x1f;
  uVar20 = (uVar18 * 0x20 | uVar18 >> 0x1b) + (uVar1 ^ uVar21 & (uVar19 ^ uVar1)) + 0x5a827999 +
           uVar4 + uVar20;
  uVar21 = uVar21 * 0x40000000 | uVar21 >> 2;
  uVar5 = uVar2 ^ uVar13 ^ uVar7 ^ uVar5;
  uVar5 = uVar5 << 1 | uVar5 >> 0x1f;
  uVar1 = (uVar20 * 0x20 | uVar20 >> 0x1b) + (uVar18 ^ uVar21 ^ uVar19) + 0x6ed9eba1 + uVar5 + uVar1
  ;
  uVar18 = uVar18 * 0x40000000 | uVar18 >> 2;
  uVar6 = uVar3 ^ uVar14 ^ uVar8 ^ uVar6;
  uVar6 = uVar6 << 1 | uVar6 >> 0x1f;
  uVar19 = (uVar1 * 0x20 | uVar1 >> 0x1b) + (uVar20 ^ uVar18 ^ uVar21) + 0x6ed9eba1 + uVar6 + uVar19
  ;
  uVar20 = uVar20 * 0x40000000 | uVar20 >> 2;
  uVar7 = uVar4 ^ uVar15 ^ uVar9 ^ uVar7;
  uVar7 = uVar7 << 1 | uVar7 >> 0x1f;
  uVar21 = (uVar19 * 0x20 | uVar19 >> 0x1b) + (uVar1 ^ uVar20 ^ uVar18) + 0x6ed9eba1 + uVar7 +
           uVar21;
  uVar1 = uVar1 * 0x40000000 | uVar1 >> 2;
  uVar8 = uVar5 ^ uVar16 ^ uVar10 ^ uVar8;
  uVar8 = uVar8 << 1 | uVar8 >> 0x1f;
  uVar18 = (uVar21 * 0x20 | uVar21 >> 0x1b) + (uVar19 ^ uVar1 ^ uVar20) + 0x6ed9eba1 + uVar8 +
           uVar18;
  uVar19 = uVar19 * 0x40000000 | uVar19 >> 2;
  uVar9 = uVar6 ^ uVar22 ^ uVar11 ^ uVar9;
  uVar9 = uVar9 << 1 | uVar9 >> 0x1f;
  uVar20 = (uVar18 * 0x20 | uVar18 >> 0x1b) + (uVar21 ^ uVar19 ^ uVar1) + 0x6ed9eba1 + uVar9 +
           uVar20;
  uVar21 = uVar21 * 0x40000000 | uVar21 >> 2;
  uVar10 = uVar7 ^ uVar2 ^ uVar12 ^ uVar10;
  uVar10 = uVar10 << 1 | uVar10 >> 0x1f;
  uVar1 = (uVar20 * 0x20 | uVar20 >> 0x1b) + (uVar18 ^ uVar21 ^ uVar19) + 0x6ed9eba1 + uVar10 +
          uVar1;
  uVar18 = uVar18 * 0x40000000 | uVar18 >> 2;
  uVar11 = uVar8 ^ uVar3 ^ uVar13 ^ uVar11;
  uVar11 = uVar11 << 1 | uVar11 >> 0x1f;
  uVar19 = (uVar1 * 0x20 | uVar1 >> 0x1b) + (uVar20 ^ uVar18 ^ uVar21) + 0x6ed9eba1 + uVar11 +
           uVar19;
  uVar20 = uVar20 * 0x40000000 | uVar20 >> 2;
  uVar12 = uVar9 ^ uVar4 ^ uVar14 ^ uVar12;
  uVar12 = uVar12 << 1 | uVar12 >> 0x1f;
  uVar21 = (uVar19 * 0x20 | uVar19 >> 0x1b) + (uVar1 ^ uVar20 ^ uVar18) + 0x6ed9eba1 + uVar12 +
           uVar21;
  uVar1 = uVar1 * 0x40000000 | uVar1 >> 2;
  uVar13 = uVar10 ^ uVar5 ^ uVar15 ^ uVar13;
  uVar13 = uVar13 << 1 | uVar13 >> 0x1f;
  uVar18 = (uVar21 * 0x20 | uVar21 >> 0x1b) + (uVar19 ^ uVar1 ^ uVar20) + 0x6ed9eba1 + uVar13 +
           uVar18;
  uVar19 = uVar19 * 0x40000000 | uVar19 >> 2;
  uVar14 = uVar11 ^ uVar6 ^ uVar16 ^ uVar14;
  uVar14 = uVar14 << 1 | uVar14 >> 0x1f;
  uVar20 = (uVar18 * 0x20 | uVar18 >> 0x1b) + (uVar21 ^ uVar19 ^ uVar1) + 0x6ed9eba1 + uVar14 +
           uVar20;
  uVar21 = uVar21 * 0x40000000 | uVar21 >> 2;
  uVar15 = uVar12 ^ uVar7 ^ uVar22 ^ uVar15;
  uVar15 = uVar15 << 1 | uVar15 >> 0x1f;
  uVar1 = (uVar20 * 0x20 | uVar20 >> 0x1b) + (uVar18 ^ uVar21 ^ uVar19) + 0x6ed9eba1 + uVar15 +
          uVar1;
  uVar18 = uVar18 * 0x40000000 | uVar18 >> 2;
  uVar16 = uVar13 ^ uVar8 ^ uVar2 ^ uVar16;
  uVar16 = uVar16 << 1 | uVar16 >> 0x1f;
  uVar19 = (uVar1 * 0x20 | uVar1 >> 0x1b) + (uVar20 ^ uVar18 ^ uVar21) + 0x6ed9eba1 + uVar16 +
           uVar19;
  uVar20 = uVar20 * 0x40000000 | uVar20 >> 2;
  uVar22 = uVar14 ^ uVar9 ^ uVar3 ^ uVar22;
  uVar17 = uVar22 << 1 | uVar22 >> 0x1f;
  uVar21 = (uVar19 * 0x20 | uVar19 >> 0x1b) + (uVar1 ^ uVar20 ^ uVar18) + 0x6ed9eba1 + uVar17 +
           uVar21;
  uVar1 = uVar1 * 0x40000000 | uVar1 >> 2;
  uVar2 = uVar15 ^ uVar10 ^ uVar4 ^ uVar2;
  uVar2 = uVar2 << 1 | uVar2 >> 0x1f;
  uVar18 = (uVar21 * 0x20 | uVar21 >> 0x1b) + (uVar19 ^ uVar1 ^ uVar20) + 0x6ed9eba1 + uVar2 +
           uVar18;
  uVar19 = uVar19 * 0x40000000 | uVar19 >> 2;
  uVar3 = uVar16 ^ uVar11 ^ uVar5 ^ uVar3;
  uVar3 = uVar3 << 1 | uVar3 >> 0x1f;
  uVar20 = (uVar18 * 0x20 | uVar18 >> 0x1b) + (uVar21 ^ uVar19 ^ uVar1) + 0x6ed9eba1 + uVar3 +
           uVar20;
  uVar21 = uVar21 * 0x40000000 | uVar21 >> 2;
  uVar4 = uVar17 ^ uVar12 ^ uVar6 ^ uVar4;
  uVar4 = uVar4 << 1 | uVar4 >> 0x1f;
  uVar1 = (uVar20 * 0x20 | uVar20 >> 0x1b) + (uVar18 ^ uVar21 ^ uVar19) + 0x6ed9eba1 + uVar4 + uVar1
  ;
  uVar18 = uVar18 * 0x40000000 | uVar18 >> 2;
  uVar5 = uVar2 ^ uVar13 ^ uVar7 ^ uVar5;
  uVar5 = uVar5 << 1 | uVar5 >> 0x1f;
  uVar19 = (uVar1 * 0x20 | uVar1 >> 0x1b) + (uVar20 ^ uVar18 ^ uVar21) + 0x6ed9eba1 + uVar5 + uVar19
  ;
  uVar20 = uVar20 * 0x40000000 | uVar20 >> 2;
  uVar6 = uVar3 ^ uVar14 ^ uVar8 ^ uVar6;
  uVar6 = uVar6 << 1 | uVar6 >> 0x1f;
  uVar21 = (uVar19 * 0x20 | uVar19 >> 0x1b) + (uVar1 ^ uVar20 ^ uVar18) + 0x6ed9eba1 + uVar6 +
           uVar21;
  uVar1 = uVar1 * 0x40000000 | uVar1 >> 2;
  uVar7 = uVar4 ^ uVar15 ^ uVar9 ^ uVar7;
  uVar7 = uVar7 << 1 | uVar7 >> 0x1f;
  uVar18 = (uVar21 * 0x20 | uVar21 >> 0x1b) + (uVar19 ^ uVar1 ^ uVar20) + 0x6ed9eba1 + uVar7 +
           uVar18;
  uVar19 = uVar19 * 0x40000000 | uVar19 >> 2;
  uVar8 = uVar5 ^ uVar16 ^ uVar10 ^ uVar8;
  uVar8 = uVar8 << 1 | uVar8 >> 0x1f;
  uVar20 = (uVar18 * 0x20 | uVar18 >> 0x1b) + (uVar21 ^ uVar19 ^ uVar1) + 0x6ed9eba1 + uVar8 +
           uVar20;
  uVar21 = uVar21 * 0x40000000 | uVar21 >> 2;
  uVar9 = uVar6 ^ uVar17 ^ uVar11 ^ uVar9;
  uVar9 = uVar9 << 1 | uVar9 >> 0x1f;
  uVar1 = (uVar20 * 0x20 | uVar20 >> 0x1b) + (uVar18 & uVar21 | uVar19 & (uVar18 | uVar21)) +
          -0x70e44324 + uVar9 + uVar1;
  uVar18 = uVar18 * 0x40000000 | uVar18 >> 2;
  uVar10 = uVar7 ^ uVar2 ^ uVar12 ^ uVar10;
  uVar10 = uVar10 << 1 | uVar10 >> 0x1f;
  uVar19 = (uVar1 * 0x20 | uVar1 >> 0x1b) + (uVar20 & uVar18 | uVar21 & (uVar20 | uVar18)) +
           -0x70e44324 + uVar10 + uVar19;
  uVar20 = uVar20 * 0x40000000 | uVar20 >> 2;
  uVar11 = uVar8 ^ uVar3 ^ uVar13 ^ uVar11;
  uVar11 = uVar11 << 1 | uVar11 >> 0x1f;
  uVar21 = (uVar19 * 0x20 | uVar19 >> 0x1b) + (uVar1 & uVar20 | uVar18 & (uVar1 | uVar20)) +
           -0x70e44324 + uVar11 + uVar21;
  uVar1 = uVar1 * 0x40000000 | uVar1 >> 2;
  uVar12 = uVar9 ^ uVar4 ^ uVar14 ^ uVar12;
  uVar12 = uVar12 << 1 | uVar12 >> 0x1f;
  uVar18 = (uVar21 * 0x20 | uVar21 >> 0x1b) + (uVar19 & uVar1 | uVar20 & (uVar19 | uVar1)) +
           -0x70e44324 + uVar12 + uVar18;
  uVar19 = uVar19 * 0x40000000 | uVar19 >> 2;
  uVar13 = uVar10 ^ uVar5 ^ uVar15 ^ uVar13;
  uVar13 = uVar13 << 1 | uVar13 >> 0x1f;
  uVar20 = (uVar18 * 0x20 | uVar18 >> 0x1b) + (uVar21 & uVar19 | uVar1 & (uVar21 | uVar19)) +
           -0x70e44324 + uVar13 + uVar20;
  uVar21 = uVar21 * 0x40000000 | uVar21 >> 2;
  uVar14 = uVar11 ^ uVar6 ^ uVar16 ^ uVar14;
  uVar14 = uVar14 << 1 | uVar14 >> 0x1f;
  uVar1 = (uVar20 * 0x20 | uVar20 >> 0x1b) + (uVar18 & uVar21 | uVar19 & (uVar18 | uVar21)) +
          -0x70e44324 + uVar14 + uVar1;
  uVar18 = uVar18 * 0x40000000 | uVar18 >> 2;
  uVar15 = uVar12 ^ uVar7 ^ uVar17 ^ uVar15;
  uVar15 = uVar15 << 1 | uVar15 >> 0x1f;
  uVar19 = (uVar1 * 0x20 | uVar1 >> 0x1b) + (uVar20 & uVar18 | uVar21 & (uVar20 | uVar18)) +
           -0x70e44324 + uVar15 + uVar19;
  uVar20 = uVar20 * 0x40000000 | uVar20 >> 2;
  uVar16 = uVar13 ^ uVar8 ^ uVar2 ^ uVar16;
  uVar16 = uVar16 << 1 | uVar16 >> 0x1f;
  uVar21 = (uVar19 * 0x20 | uVar19 >> 0x1b) + (uVar1 & uVar20 | uVar18 & (uVar1 | uVar20)) +
           -0x70e44324 + uVar16 + uVar21;
  uVar1 = uVar1 * 0x40000000 | uVar1 >> 2;
  uVar17 = uVar14 ^ uVar9 ^ uVar3 ^ uVar17;
  uVar17 = uVar17 << 1 | uVar17 >> 0x1f;
  uVar18 = (uVar21 * 0x20 | uVar21 >> 0x1b) + (uVar19 & uVar1 | uVar20 & (uVar19 | uVar1)) +
           -0x70e44324 + uVar17 + uVar18;
  uVar19 = uVar19 * 0x40000000 | uVar19 >> 2;
  uVar2 = uVar15 ^ uVar10 ^ uVar4 ^ uVar2;
  uVar2 = uVar2 << 1 | uVar2 >> 0x1f;
  uVar20 = (uVar18 * 0x20 | uVar18 >> 0x1b) + (uVar21 & uVar19 | uVar1 & (uVar21 | uVar19)) +
           -0x70e44324 + uVar2 + uVar20;
  uVar21 = uVar21 * 0x40000000 | uVar21 >> 2;
  uVar3 = uVar16 ^ uVar11 ^ uVar5 ^ uVar3;
  uVar22 = uVar3 << 1 | uVar3 >> 0x1f;
  uVar1 = (uVar20 * 0x20 | uVar20 >> 0x1b) + (uVar18 & uVar21 | uVar19 & (uVar18 | uVar21)) +
          -0x70e44324 + uVar22 + uVar1;
  uVar18 = uVar18 * 0x40000000 | uVar18 >> 2;
  uVar4 = uVar17 ^ uVar12 ^ uVar6 ^ uVar4;
  uVar23 = uVar4 << 1 | uVar4 >> 0x1f;
  uVar19 = (uVar1 * 0x20 | uVar1 >> 0x1b) + (uVar20 & uVar18 | uVar21 & (uVar20 | uVar18)) +
           -0x70e44324 + uVar23 + uVar19;
  uVar20 = uVar20 * 0x40000000 | uVar20 >> 2;
  uVar5 = uVar2 ^ uVar13 ^ uVar7 ^ uVar5;
  uVar24 = uVar5 << 1 | uVar5 >> 0x1f;
  uVar21 = (uVar19 * 0x20 | uVar19 >> 0x1b) + (uVar1 & uVar20 | uVar18 & (uVar1 | uVar20)) +
           -0x70e44324 + uVar24 + uVar21;
  uVar1 = uVar1 * 0x40000000 | uVar1 >> 2;
  uVar6 = uVar22 ^ uVar14 ^ uVar8 ^ uVar6;
  uVar25 = uVar6 << 1 | uVar6 >> 0x1f;
  uVar18 = (uVar21 * 0x20 | uVar21 >> 0x1b) + (uVar19 & uVar1 | uVar20 & (uVar19 | uVar1)) +
           -0x70e44324 + uVar25 + uVar18;
  uVar19 = uVar19 * 0x40000000 | uVar19 >> 2;
  uVar7 = uVar23 ^ uVar15 ^ uVar9 ^ uVar7;
  uVar26 = uVar7 << 1 | uVar7 >> 0x1f;
  uVar20 = (uVar18 * 0x20 | uVar18 >> 0x1b) + (uVar21 & uVar19 | uVar1 & (uVar21 | uVar19)) +
           -0x70e44324 + uVar26 + uVar20;
  uVar21 = uVar21 * 0x40000000 | uVar21 >> 2;
  uVar8 = uVar24 ^ uVar16 ^ uVar10 ^ uVar8;
  uVar27 = uVar8 << 1 | uVar8 >> 0x1f;
  uVar1 = (uVar20 * 0x20 | uVar20 >> 0x1b) + (uVar18 & uVar21 | uVar19 & (uVar18 | uVar21)) +
          -0x70e44324 + uVar27 + uVar1;
  uVar18 = uVar18 * 0x40000000 | uVar18 >> 2;
  uVar9 = uVar25 ^ uVar17 ^ uVar11 ^ uVar9;
  uVar28 = uVar9 << 1 | uVar9 >> 0x1f;
  uVar19 = (uVar1 * 0x20 | uVar1 >> 0x1b) + (uVar20 & uVar18 | uVar21 & (uVar20 | uVar18)) +
           -0x70e44324 + uVar28 + uVar19;
  uVar20 = uVar20 * 0x40000000 | uVar20 >> 2;
  uVar10 = uVar26 ^ uVar2 ^ uVar12 ^ uVar10;
  uVar29 = uVar10 << 1 | uVar10 >> 0x1f;
  uVar21 = (uVar19 * 0x20 | uVar19 >> 0x1b) + (uVar1 & uVar20 | uVar18 & (uVar1 | uVar20)) +
           -0x70e44324 + uVar29 + uVar21;
  uVar1 = uVar1 * 0x40000000 | uVar1 >> 2;
  uVar11 = uVar27 ^ uVar22 ^ uVar13 ^ uVar11;
  uVar30 = uVar11 << 1 | uVar11 >> 0x1f;
  uVar18 = (uVar21 * 0x20 | uVar21 >> 0x1b) + (uVar19 & uVar1 | uVar20 & (uVar19 | uVar1)) +
           -0x70e44324 + uVar30 + uVar18;
  uVar19 = uVar19 * 0x40000000 | uVar19 >> 2;
  uVar12 = uVar28 ^ uVar23 ^ uVar14 ^ uVar12;
  uVar31 = uVar12 << 1 | uVar12 >> 0x1f;
  uVar20 = (uVar18 * 0x20 | uVar18 >> 0x1b) + (uVar21 & uVar19 | uVar1 & (uVar21 | uVar19)) +
           -0x70e44324 + uVar31 + uVar20;
  uVar21 = uVar21 * 0x40000000 | uVar21 >> 2;
  uVar13 = uVar29 ^ uVar24 ^ uVar15 ^ uVar13;
  uVar13 = uVar13 << 1 | uVar13 >> 0x1f;
  uVar1 = (uVar20 * 0x20 | uVar20 >> 0x1b) + (uVar18 ^ uVar21 ^ uVar19) + -0x359d3e2a + uVar13 +
          uVar1;
  uVar18 = uVar18 * 0x40000000 | uVar18 >> 2;
  uVar14 = uVar30 ^ uVar25 ^ uVar16 ^ uVar14;
  uVar14 = uVar14 << 1 | uVar14 >> 0x1f;
  uVar19 = (uVar1 * 0x20 | uVar1 >> 0x1b) + (uVar20 ^ uVar18 ^ uVar21) + -0x359d3e2a + uVar14 +
           uVar19;
  uVar20 = uVar20 * 0x40000000 | uVar20 >> 2;
  uVar15 = uVar31 ^ uVar26 ^ uVar17 ^ uVar15;
  uVar15 = uVar15 << 1 | uVar15 >> 0x1f;
  uVar21 = (uVar19 * 0x20 | uVar19 >> 0x1b) + (uVar1 ^ uVar20 ^ uVar18) + -0x359d3e2a + uVar15 +
           uVar21;
  uVar1 = uVar1 * 0x40000000 | uVar1 >> 2;
  uVar16 = uVar13 ^ uVar27 ^ uVar2 ^ uVar16;
  uVar16 = uVar16 << 1 | uVar16 >> 0x1f;
  uVar18 = (uVar21 * 0x20 | uVar21 >> 0x1b) + (uVar19 ^ uVar1 ^ uVar20) + -0x359d3e2a + uVar16 +
           uVar18;
  uVar19 = uVar19 * 0x40000000 | uVar19 >> 2;
  uVar17 = uVar14 ^ uVar28 ^ uVar22 ^ uVar17;
  uVar3 = uVar17 << 1 | uVar17 >> 0x1f;
  uVar20 = (uVar18 * 0x20 | uVar18 >> 0x1b) + (uVar21 ^ uVar19 ^ uVar1) + -0x359d3e2a + uVar3 +
           uVar20;
  uVar21 = uVar21 * 0x40000000 | uVar21 >> 2;
  uVar2 = uVar15 ^ uVar29 ^ uVar23 ^ uVar2;
  uVar4 = uVar2 << 1 | uVar2 >> 0x1f;
  uVar1 = (uVar20 * 0x20 | uVar20 >> 0x1b) + (uVar18 ^ uVar21 ^ uVar19) + -0x359d3e2a + uVar4 +
          uVar1;
  uVar18 = uVar18 * 0x40000000 | uVar18 >> 2;
  uVar22 = uVar16 ^ uVar30 ^ uVar24 ^ uVar22;
  uVar2 = uVar22 << 1 | uVar22 >> 0x1f;
  uVar19 = (uVar1 * 0x20 | uVar1 >> 0x1b) + (uVar20 ^ uVar18 ^ uVar21) + -0x359d3e2a + uVar2 +
           uVar19;
  uVar20 = uVar20 * 0x40000000 | uVar20 >> 2;
  uVar23 = uVar3 ^ uVar31 ^ uVar25 ^ uVar23;
  uVar5 = uVar23 << 1 | uVar23 >> 0x1f;
  uVar21 = (uVar19 * 0x20 | uVar19 >> 0x1b) + (uVar1 ^ uVar20 ^ uVar18) + -0x359d3e2a + uVar5 +
           uVar21;
  uVar1 = uVar1 * 0x40000000 | uVar1 >> 2;
  uVar24 = uVar4 ^ uVar13 ^ uVar26 ^ uVar24;
  uVar6 = uVar24 << 1 | uVar24 >> 0x1f;
  uVar18 = (uVar21 * 0x20 | uVar21 >> 0x1b) + (uVar19 ^ uVar1 ^ uVar20) + -0x359d3e2a + uVar6 +
           uVar18;
  uVar19 = uVar19 * 0x40000000 | uVar19 >> 2;
  uVar25 = uVar2 ^ uVar14 ^ uVar27 ^ uVar25;
  uVar7 = uVar25 << 1 | uVar25 >> 0x1f;
  uVar20 = (uVar18 * 0x20 | uVar18 >> 0x1b) + (uVar21 ^ uVar19 ^ uVar1) + -0x359d3e2a + uVar7 +
           uVar20;
  uVar21 = uVar21 * 0x40000000 | uVar21 >> 2;
  uVar26 = uVar5 ^ uVar15 ^ uVar28 ^ uVar26;
  uVar8 = uVar26 << 1 | uVar26 >> 0x1f;
  uVar1 = (uVar20 * 0x20 | uVar20 >> 0x1b) + (uVar18 ^ uVar21 ^ uVar19) + -0x359d3e2a + uVar8 +
          uVar1;
  uVar18 = uVar18 * 0x40000000 | uVar18 >> 2;
  uVar27 = uVar6 ^ uVar16 ^ uVar29 ^ uVar27;
  uVar9 = uVar27 << 1 | uVar27 >> 0x1f;
  uVar19 = (uVar1 * 0x20 | uVar1 >> 0x1b) + (uVar20 ^ uVar18 ^ uVar21) + -0x359d3e2a + uVar9 +
           uVar19;
  uVar20 = uVar20 * 0x40000000 | uVar20 >> 2;
  uVar28 = uVar7 ^ uVar3 ^ uVar30 ^ uVar28;
  uVar10 = uVar28 << 1 | uVar28 >> 0x1f;
  uVar21 = (uVar19 * 0x20 | uVar19 >> 0x1b) + (uVar1 ^ uVar20 ^ uVar18) + -0x359d3e2a + uVar10 +
           uVar21;
  uVar1 = uVar1 * 0x40000000 | uVar1 >> 2;
  uVar29 = uVar8 ^ uVar4 ^ uVar31 ^ uVar29;
  uVar11 = uVar29 << 1 | uVar29 >> 0x1f;
  uVar18 = (uVar21 * 0x20 | uVar21 >> 0x1b) + (uVar19 ^ uVar1 ^ uVar20) + -0x359d3e2a + uVar11 +
           uVar18;
  uVar19 = uVar19 * 0x40000000 | uVar19 >> 2;
  uVar30 = uVar9 ^ uVar2 ^ uVar13 ^ uVar30;
  uVar12 = uVar30 << 1 | uVar30 >> 0x1f;
  uVar20 = (uVar18 * 0x20 | uVar18 >> 0x1b) + (uVar21 ^ uVar19 ^ uVar1) + -0x359d3e2a + uVar12 +
           uVar20;
  uVar21 = uVar21 * 0x40000000 | uVar21 >> 2;
  uVar31 = uVar10 ^ uVar5 ^ uVar14 ^ uVar31;
  uVar5 = uVar31 << 1 | uVar31 >> 0x1f;
  uVar1 = (uVar20 * 0x20 | uVar20 >> 0x1b) + (uVar18 ^ uVar21 ^ uVar19) + -0x359d3e2a + uVar5 +
          uVar1;
  uVar2 = uVar18 * 0x40000000 | uVar18 >> 2;
  uVar13 = uVar11 ^ uVar6 ^ uVar15 ^ uVar13;
  uVar6 = uVar13 << 1 | uVar13 >> 0x1f;
  uVar19 = (uVar1 * 0x20 | uVar1 >> 0x1b) + (uVar20 ^ uVar2 ^ uVar21) + -0x359d3e2a + uVar6 + uVar19
  ;
  uVar20 = uVar20 * 0x40000000 | uVar20 >> 2;
  uVar14 = uVar12 ^ uVar7 ^ uVar16 ^ uVar14;
  uVar21 = (uVar19 * 0x20 | uVar19 >> 0x1b) + (uVar1 ^ uVar20 ^ uVar2) + -0x359d3e2a +
           (uVar14 << 1 | uVar14 >> 0x1f) + uVar21;
  uVar18 = uVar1 * 0x40000000 | uVar1 >> 2;
  uVar15 = uVar5 ^ uVar8 ^ uVar3 ^ uVar15;
  uVar2 = (uVar21 * 0x20 | uVar21 >> 0x1b) + (uVar19 ^ uVar18 ^ uVar20) + -0x359d3e2a +
          (uVar15 << 1 | uVar15 >> 0x1f) + uVar2;
  uVar19 = uVar19 * 0x40000000 | uVar19 >> 2;
  uVar16 = uVar6 ^ uVar9 ^ uVar4 ^ uVar16;
  ctx->state[0] =
       (uVar2 * 0x20 | uVar2 >> 0x1b) + (uVar21 ^ uVar19 ^ uVar18) + -0x359d3e2a +
       (uVar16 << 1 | uVar16 >> 0x1f) + uVar20 + ctx->state[0];
  ctx->state[1] = uVar2 + ctx->state[1];
  ctx->state[2] = (uVar21 * 0x40000000 | uVar21 >> 2) + ctx->state[2];
  ctx->state[3] = uVar19 + ctx->state[3];
  ctx->state[4] = uVar18 + ctx->state[4];
  return;
}

Assistant:

void mbedtls_sha1_process( mbedtls_sha1_context *ctx, const unsigned char data[64] )
{
    uint32_t temp, W[16], A, B, C, D, E;

    GET_UINT32_BE( W[ 0], data,  0 );
    GET_UINT32_BE( W[ 1], data,  4 );
    GET_UINT32_BE( W[ 2], data,  8 );
    GET_UINT32_BE( W[ 3], data, 12 );
    GET_UINT32_BE( W[ 4], data, 16 );
    GET_UINT32_BE( W[ 5], data, 20 );
    GET_UINT32_BE( W[ 6], data, 24 );
    GET_UINT32_BE( W[ 7], data, 28 );
    GET_UINT32_BE( W[ 8], data, 32 );
    GET_UINT32_BE( W[ 9], data, 36 );
    GET_UINT32_BE( W[10], data, 40 );
    GET_UINT32_BE( W[11], data, 44 );
    GET_UINT32_BE( W[12], data, 48 );
    GET_UINT32_BE( W[13], data, 52 );
    GET_UINT32_BE( W[14], data, 56 );
    GET_UINT32_BE( W[15], data, 60 );

#define S(x,n) ((x << n) | ((x & 0xFFFFFFFF) >> (32 - n)))

#define R(t)                                            \
(                                                       \
    temp = W[( t -  3 ) & 0x0F] ^ W[( t - 8 ) & 0x0F] ^ \
           W[( t - 14 ) & 0x0F] ^ W[  t       & 0x0F],  \
    ( W[t & 0x0F] = S(temp,1) )                         \
)

#define P(a,b,c,d,e,x)                                  \
{                                                       \
    e += S(a,5) + F(b,c,d) + K + x; b = S(b,30);        \
}

    A = ctx->state[0];
    B = ctx->state[1];
    C = ctx->state[2];
    D = ctx->state[3];
    E = ctx->state[4];

#define F(x,y,z) (z ^ (x & (y ^ z)))
#define K 0x5A827999

    P( A, B, C, D, E, W[0]  );
    P( E, A, B, C, D, W[1]  );
    P( D, E, A, B, C, W[2]  );
    P( C, D, E, A, B, W[3]  );
    P( B, C, D, E, A, W[4]  );
    P( A, B, C, D, E, W[5]  );
    P( E, A, B, C, D, W[6]  );
    P( D, E, A, B, C, W[7]  );
    P( C, D, E, A, B, W[8]  );
    P( B, C, D, E, A, W[9]  );
    P( A, B, C, D, E, W[10] );
    P( E, A, B, C, D, W[11] );
    P( D, E, A, B, C, W[12] );
    P( C, D, E, A, B, W[13] );
    P( B, C, D, E, A, W[14] );
    P( A, B, C, D, E, W[15] );
    P( E, A, B, C, D, R(16) );
    P( D, E, A, B, C, R(17) );
    P( C, D, E, A, B, R(18) );
    P( B, C, D, E, A, R(19) );

#undef K
#undef F

#define F(x,y,z) (x ^ y ^ z)
#define K 0x6ED9EBA1

    P( A, B, C, D, E, R(20) );
    P( E, A, B, C, D, R(21) );
    P( D, E, A, B, C, R(22) );
    P( C, D, E, A, B, R(23) );
    P( B, C, D, E, A, R(24) );
    P( A, B, C, D, E, R(25) );
    P( E, A, B, C, D, R(26) );
    P( D, E, A, B, C, R(27) );
    P( C, D, E, A, B, R(28) );
    P( B, C, D, E, A, R(29) );
    P( A, B, C, D, E, R(30) );
    P( E, A, B, C, D, R(31) );
    P( D, E, A, B, C, R(32) );
    P( C, D, E, A, B, R(33) );
    P( B, C, D, E, A, R(34) );
    P( A, B, C, D, E, R(35) );
    P( E, A, B, C, D, R(36) );
    P( D, E, A, B, C, R(37) );
    P( C, D, E, A, B, R(38) );
    P( B, C, D, E, A, R(39) );

#undef K
#undef F

#define F(x,y,z) ((x & y) | (z & (x | y)))
#define K 0x8F1BBCDC

    P( A, B, C, D, E, R(40) );
    P( E, A, B, C, D, R(41) );
    P( D, E, A, B, C, R(42) );
    P( C, D, E, A, B, R(43) );
    P( B, C, D, E, A, R(44) );
    P( A, B, C, D, E, R(45) );
    P( E, A, B, C, D, R(46) );
    P( D, E, A, B, C, R(47) );
    P( C, D, E, A, B, R(48) );
    P( B, C, D, E, A, R(49) );
    P( A, B, C, D, E, R(50) );
    P( E, A, B, C, D, R(51) );
    P( D, E, A, B, C, R(52) );
    P( C, D, E, A, B, R(53) );
    P( B, C, D, E, A, R(54) );
    P( A, B, C, D, E, R(55) );
    P( E, A, B, C, D, R(56) );
    P( D, E, A, B, C, R(57) );
    P( C, D, E, A, B, R(58) );
    P( B, C, D, E, A, R(59) );

#undef K
#undef F

#define F(x,y,z) (x ^ y ^ z)
#define K 0xCA62C1D6

    P( A, B, C, D, E, R(60) );
    P( E, A, B, C, D, R(61) );
    P( D, E, A, B, C, R(62) );
    P( C, D, E, A, B, R(63) );
    P( B, C, D, E, A, R(64) );
    P( A, B, C, D, E, R(65) );
    P( E, A, B, C, D, R(66) );
    P( D, E, A, B, C, R(67) );
    P( C, D, E, A, B, R(68) );
    P( B, C, D, E, A, R(69) );
    P( A, B, C, D, E, R(70) );
    P( E, A, B, C, D, R(71) );
    P( D, E, A, B, C, R(72) );
    P( C, D, E, A, B, R(73) );
    P( B, C, D, E, A, R(74) );
    P( A, B, C, D, E, R(75) );
    P( E, A, B, C, D, R(76) );
    P( D, E, A, B, C, R(77) );
    P( C, D, E, A, B, R(78) );
    P( B, C, D, E, A, R(79) );

#undef K
#undef F

    ctx->state[0] += A;
    ctx->state[1] += B;
    ctx->state[2] += C;
    ctx->state[3] += D;
    ctx->state[4] += E;
}